

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void print_image<cert::OutputImage<cert::Color,120ul,120ul>>
               (ofstream *ppm,OutputImage<cert::Color,_120UL,_120UL> *frame)

{
  Color CVar1;
  size_t sVar2;
  ostream *poVar3;
  byte bStack_2a;
  int b;
  byte local_23;
  int g;
  int local_1c;
  int r;
  int i;
  OutputImage<cert::Color,_120UL,_120UL> *frame_local;
  ofstream *ppm_local;
  
  local_1c = 0;
  while( true ) {
    sVar2 = cert::OutputImage<cert::Color,_120UL,_120UL>::size(frame);
    if (sVar2 <= (ulong)(long)local_1c) break;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_120UL>::at(frame,local_1c);
    local_23 = CVar1.r;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_120UL>::at(frame,local_1c);
    bStack_2a = CVar1.g;
    CVar1 = cert::OutputImage<cert::Color,_120UL,_120UL>::at(frame,local_1c);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)ppm,(uint)local_23);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)bStack_2a);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)CVar1.b);
    std::operator<<(poVar3,"\n");
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void print_image (std::ofstream& ppm, T const& frame)
{
	for (int i = 0; i < frame.size (); i++)
	{
		int r = static_cast<int> (frame.at (i).r);
		int g = static_cast<int> (frame.at (i).g);
		int b = static_cast<int> (frame.at (i).b);

		ppm << r << " " << g << " " << b << "\n";
	}
}